

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fTessellationTests.cpp
# Opt level: O1

IterateResult __thiscall
deqp::gles31::Functional::anon_unknown_1::SymmetricOuterEdgeCase::iterate
          (SymmetricOuterEdgeCase *this)

{
  qpTestLog *pqVar1;
  float *pfVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  TessPrimitiveType TVar6;
  RenderContext *pRVar7;
  void *pvVar8;
  pointer pOVar9;
  pointer pfVar10;
  pointer pVVar11;
  bool bVar12;
  int i_5;
  int iVar13;
  deUint32 dVar14;
  int iVar15;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  ObjectTraits *pOVar16;
  undefined4 extraout_var_02;
  undefined4 extraout_var_03;
  undefined4 extraout_var_04;
  undefined4 extraout_var_05;
  long lVar17;
  long *plVar18;
  undefined8 *puVar19;
  undefined4 *puVar20;
  undefined4 *puVar21;
  TestError *pTVar22;
  int i_11;
  long lVar23;
  long lVar24;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar25;
  ulong *puVar26;
  TestLog *pTVar27;
  long lVar28;
  pointer pfVar29;
  _Base_ptr p_Var30;
  byte bVar31;
  float *__result;
  float *pfVar32;
  ulong uVar33;
  undefined8 extraout_RDX;
  _Base_ptr p_Var34;
  undefined8 extraout_RDX_00;
  undefined8 extraout_RDX_01;
  undefined8 extraout_RDX_02;
  undefined8 extraout_RDX_03;
  undefined8 uVar35;
  int i;
  qpTestLog *pqVar36;
  TestLog TVar37;
  ulong uVar38;
  undefined4 *puVar39;
  _Rb_tree_const_iterator<tcu::Vector<float,_3>_> __last1;
  ulong uVar40;
  set<tcu::Vector<float,_3>,_deqp::gles31::Functional::(anonymous_namespace)::VecLexLessThan<3>,_std::allocator<tcu::Vector<float,_3>_>_>
  *this_00;
  int i_1;
  _Base_ptr p_Var41;
  uint uVar42;
  ulong uVar43;
  bool bVar44;
  Vector<bool,_3> result_2;
  Vector<bool,_3> result;
  Vec3Set nonMirroredEdgeVertices;
  Vec3 endpointB;
  Vec3Set mirroredEdgeVertices;
  Vector<bool,_2> result_4;
  vector<float,_std::allocator<float>_> patchTessLevels_1;
  vector<deqp::gles31::Functional::(anonymous_namespace)::OuterEdgeDescription,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::OuterEdgeDescription>_>
  edgeDescriptions;
  Result tfResult;
  RandomViewport viewport;
  TFHandler tfHandler;
  vector<float,_std::allocator<float>_> patchTessLevels;
  Random rnd;
  VertexArrayBinding bindings [1];
  undefined1 local_588 [8];
  ulong local_580;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_578;
  undefined1 local_568 [8];
  ulong local_560;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_558;
  float local_544;
  undefined1 local_540 [8];
  ulong local_538;
  undefined1 local_530 [16];
  undefined1 local_520 [32];
  _Base_ptr local_500;
  size_t local_4f8;
  pointer local_4f0;
  undefined1 local_4e8 [8];
  float local_4e0;
  undefined4 uStack_4dc;
  TestLog local_4d8;
  deUint32 local_4c4;
  TestLog *local_4c0;
  set<tcu::Vector<float,_3>,_deqp::gles31::Functional::(anonymous_namespace)::VecLexLessThan<3>,_std::allocator<tcu::Vector<float,_3>_>_>
  local_4b8;
  vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_> local_488;
  long local_470;
  vector<float,_std::allocator<float>_> local_468;
  long local_450;
  long local_448;
  vector<deqp::gles31::Functional::(anonymous_namespace)::OuterEdgeDescription,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::OuterEdgeDescription>_>
  local_440;
  float local_428;
  vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_> local_420;
  RandomViewport local_408;
  RenderContext *local_3f8;
  ObjectWrapper local_3f0;
  ObjectWrapper local_3d8;
  ObjectWrapper local_3c0;
  undefined1 local_3a8 [4];
  float fStack_3a4;
  undefined1 local_3a0 [8];
  pointer local_398;
  _func_int *local_390 [2];
  int local_380;
  ios_base local_338 [8];
  ios_base local_330 [264];
  SymmetricOuterEdgeCase *local_228;
  long local_220;
  ulong local_218;
  ulong local_210;
  undefined1 local_208 [4];
  float fStack_204;
  undefined1 local_200 [8];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1f8 [6];
  ios_base local_190 [264];
  undefined1 local_88 [8];
  _Alloc_hider local_80;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_70;
  int local_60;
  VertexArrayPointer local_58;
  
  local_4c0 = ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
  pRVar7 = ((this->super_TestCase).m_context)->m_renderCtx;
  iVar13 = (*pRVar7->_vptr_RenderContext[4])(pRVar7);
  dVar14 = deStringHash((this->super_TestCase).super_TestCase.super_TestNode.m_name._M_dataplus._M_p
                       );
  deqp::gls::TextureTestUtil::RandomViewport::RandomViewport
            (&local_408,(RenderTarget *)CONCAT44(extraout_var,iVar13),0x10,0x10,dVar14);
  iVar13 = (*pRVar7->_vptr_RenderContext[3])(pRVar7);
  lVar24 = CONCAT44(extraout_var_00,iVar13);
  outerEdgeDescriptions(&local_440,this->m_primitiveType);
  lVar23 = 4;
  pfVar32 = iterate::singleOuterEdgeLevels;
  do {
    if (*pfVar32 <= *(float *)((long)iterate::singleOuterEdgeLevels + lVar23) &&
        *(float *)((long)iterate::singleOuterEdgeLevels + lVar23) != *pfVar32) {
      pfVar32 = (float *)((long)iterate::singleOuterEdgeLevels + lVar23);
    }
    lVar23 = lVar23 + 4;
  } while (lVar23 != 0x30);
  local_4f0 = (pointer)CONCAT44(local_4f0._4_4_,*pfVar32);
  deRandom_init((deRandom *)local_208,0x7b);
  generateRandomPatchTessLevels
            ((vector<float,_std::allocator<float>_> *)local_3a8,1,0,local_4f0._0_4_,
             (Random *)local_208);
  iVar13 = referenceVertexCount
                     (this->m_primitiveType,this->m_spacing,this->m_usePointMode,(float *)_local_3a8
                      ,(float *)&_local_3a8->lock);
  if (_local_3a8 != (qpTestLog *)0x0) {
    operator_delete(_local_3a8,(long)local_398 - (long)_local_3a8);
  }
  pRVar7 = ((this->super_TestCase).m_context)->m_renderCtx;
  local_3f8 = pRVar7;
  iVar15 = (*pRVar7->_vptr_RenderContext[3])(pRVar7);
  pOVar16 = glu::objectTraits(OBJECTTYPE_TRANSFORM_FEEDBACK);
  glu::ObjectWrapper::ObjectWrapper
            (&local_3f0,(Functions *)CONCAT44(extraout_var_01,iVar15),pOVar16);
  iVar15 = (*pRVar7->_vptr_RenderContext[3])(pRVar7);
  pOVar16 = glu::objectTraits(OBJECTTYPE_BUFFER);
  glu::ObjectWrapper::ObjectWrapper
            (&local_3d8,(Functions *)CONCAT44(extraout_var_02,iVar15),pOVar16);
  iVar15 = (*pRVar7->_vptr_RenderContext[3])(pRVar7);
  pOVar16 = glu::objectTraits(OBJECTTYPE_QUERY);
  glu::ObjectWrapper::ObjectWrapper
            (&local_3c0,(Functions *)CONCAT44(extraout_var_03,iVar15),pOVar16);
  iVar15 = (*local_3f8->_vptr_RenderContext[3])();
  (**(code **)(CONCAT44(extraout_var_04,iVar15) + 0x40))(0x8c8e,local_3d8.m_object);
  (**(code **)(CONCAT44(extraout_var_04,iVar15) + 0x150))
            (0x8c8e,(long)(iVar13 * 0x10 + 0x30),0,0x88e9);
  (**(code **)(lVar24 + 0x1a00))(local_408.x,local_408.y,local_408.width,local_408.height);
  (**(code **)(lVar24 + 0xfd8))(0x8e72);
  local_220 = lVar24;
  if ((int)((ulong)((long)local_440.
                          super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::OuterEdgeDescription,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::OuterEdgeDescription>_>
                          ._M_impl.super__Vector_impl_data._M_finish -
                   (long)local_440.
                         super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::OuterEdgeDescription,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::OuterEdgeDescription>_>
                         ._M_impl.super__Vector_impl_data._M_start) >> 4) < 1) {
    glu::ObjectWrapper::~ObjectWrapper(&local_3c0);
    glu::ObjectWrapper::~ObjectWrapper(&local_3d8);
    glu::ObjectWrapper::~ObjectWrapper(&local_3f0);
  }
  else {
    lVar24 = 8;
    lVar23 = 0;
    local_228 = this;
    do {
      local_4f0 = local_440.
                  super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::OuterEdgeDescription,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::OuterEdgeDescription>_>
                  ._M_impl.super__Vector_impl_data._M_start + lVar23;
      local_448 = (long)(local_440.
                         super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::OuterEdgeDescription,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::OuterEdgeDescription>_>
                         ._M_impl.super__Vector_impl_data._M_start)->constantCoordinateValueChoices
                  + lVar24 + -4;
      uVar43 = 0;
      uVar33 = 0;
      local_470 = lVar23;
      local_450 = lVar24;
      do {
        local_544 = iterate::singleOuterEdgeLevels[uVar43];
        local_218 = uVar33;
        local_210 = uVar43;
        deRandom_init((deRandom *)local_3a8,0x7b);
        generateRandomPatchTessLevels(&local_468,1,(int)local_470,local_544,(Random *)local_3a8);
        _local_208 = local_200 + 8;
        std::__cxx11::string::_M_construct<char_const*>((string *)local_208,"in_v_attr","");
        pfVar10 = local_468.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                  super__Vector_impl_data._M_finish;
        pfVar29 = local_468.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                  super__Vector_impl_data._M_start;
        _local_3a8 = (qpTestLog *)CONCAT44(fStack_3a4,1);
        local_3a0 = (undefined1  [8])local_390;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)local_3a0,_local_208,(char *)((long)local_200 + (long)_local_208));
        local_380 = 0;
        local_88._0_4_ = local_3a8;
        local_80._M_p = (pointer)&local_70;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_80,local_3a0,(long)local_398 + (long)local_3a0);
        local_60 = local_380;
        local_58.componentType = VTX_COMP_FLOAT;
        local_58.convert = VTX_COMP_CONVERT_NONE;
        local_58.numComponents = 1;
        local_58.numElements = (int)((ulong)((long)pfVar10 - (long)pfVar29) >> 2);
        local_58.stride = 0;
        local_58.data = pfVar29;
        if (local_3a0 != (undefined1  [8])local_390) {
          operator_delete((void *)local_3a0,(ulong)(local_390[0] + 1));
        }
        pOVar9 = local_4f0;
        if (_local_208 != local_200 + 8) {
          operator_delete(_local_208,(ulong)(local_1f8[0]._M_allocated_capacity + 1));
        }
        _local_3a8 = (qpTestLog *)local_4c0;
        std::__cxx11::ostringstream::ostringstream((ostringstream *)local_3a0);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_3a0,"Testing with outer tessellation level ",0x26);
        std::ostream::_M_insert<double>((double)local_544);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_3a0," for the ",9);
        Functional::(anonymous_namespace)::OuterEdgeDescription::description_abi_cxx11_
                  ((string *)local_208,pOVar9);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_3a0,_local_208,(long)local_200);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_3a0," edge, and with various levels for other edges",0x2e);
        tcu::MessageBuilder::operator<<
                  ((MessageBuilder *)local_3a8,(EndMessageToken *)&tcu::TestLog::EndMessage);
        if (_local_208 != local_200 + 8) {
          operator_delete(_local_208,(ulong)(local_1f8[0]._M_allocated_capacity + 1));
        }
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_3a0);
        std::ios_base::~ios_base(local_330);
        dVar14 = (((this->m_program).m_ptr)->m_program).m_program;
        (**(code **)(local_220 + 0x1680))(dVar14);
        uVar42 = 0;
        if (this->m_usePointMode == false) {
          uVar42 = 0xffffffff;
          if ((ulong)this->m_primitiveType < 3) {
            uVar42 = *(uint *)(&DAT_01c85fd0 + (ulong)this->m_primitiveType * 4);
          }
        }
        uVar43 = (long)local_468.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                       super__Vector_impl_data._M_finish -
                 (long)local_468.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                       super__Vector_impl_data._M_start;
        iVar13 = (*local_3f8->_vptr_RenderContext[3])();
        lVar24 = CONCAT44(extraout_var_05,iVar13);
        (**(code **)(lVar24 + 0xd0))(0x8e22,local_3f0.m_object);
        (**(code **)(lVar24 + 0x40))(0x8c8e,local_3d8.m_object);
        (**(code **)(lVar24 + 0x48))(0x8c8e,0,local_3d8.m_object);
        (**(code **)(lVar24 + 0x20))(0x8c88,local_3c0.m_object);
        (**(code **)(lVar24 + 0x30))(uVar42);
        fStack_3a4 = (float)(uVar43 >> 2);
        local_3a8 = (undefined1  [4])0x7;
        local_3a0._0_4_ = 3;
        local_398 = (pointer)0x0;
        glu::draw(local_3f8,dVar14,1,(VertexArrayBinding *)local_88,(PrimitiveList *)local_3a8,
                  (DrawUtilCallback *)0x0);
        dVar14 = (**(code **)(lVar24 + 0x800))();
        glu::checkError(dVar14,"Draw failed",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fTessellationTests.cpp"
                        ,0x15e);
        (**(code **)(lVar24 + 0x638))();
        (**(code **)(lVar24 + 0x628))(0x8c88);
        _local_3a8 = (qpTestLog *)CONCAT44(fStack_3a4,0xffffffff);
        (**(code **)(lVar24 + 0xa20))(local_3c0.m_object,0x8866,local_3a8);
        local_544 = (float)local_3a8;
        if (local_3a8 == (undefined1  [4])0xffffffff) {
          pTVar22 = (TestError *)__cxa_allocate_exception(0x38);
          tcu::TestError::TestError
                    (pTVar22,(char *)0x0,"result != (deUint32)-1",
                     "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fTessellationTests.cpp"
                     ,0x104);
          __cxa_throw(pTVar22,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
        }
        iVar13 = -1;
        if (uVar42 < 5) {
          iVar13 = (&DAT_01c85fdc)[uVar42];
        }
        uVar42 = iVar13 * (int)local_3a8;
        std::vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::vector
                  (&local_488,(long)(int)uVar42,(allocator_type *)local_3a8);
        lVar23 = CONCAT62(local_488.
                          super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                          ._M_impl.super__Vector_impl_data._M_start._2_6_,
                          local_488.
                          super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                          ._M_impl.super__Vector_impl_data._M_start._0_2_);
        lVar17 = (**(code **)(lVar24 + 0xd00))(0x8c8e,0,(long)(int)(uVar42 * 0x10),1);
        local_4c4 = (**(code **)(lVar24 + 0x800))();
        local_540 = (undefined1  [8])local_530;
        local_538 = 0;
        local_530[0] = 0;
        plVar18 = (long *)std::__cxx11::string::append(local_540);
        local_588 = (undefined1  [8])&local_578;
        paVar25 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)(plVar18 + 2);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*plVar18 == paVar25) {
          local_578._M_allocated_capacity = paVar25->_M_allocated_capacity;
          local_578._8_8_ = plVar18[3];
        }
        else {
          local_578._M_allocated_capacity = paVar25->_M_allocated_capacity;
          local_588 = (undefined1  [8])*plVar18;
        }
        local_580 = plVar18[1];
        *plVar18 = (long)paVar25;
        plVar18[1] = 0;
        *(undefined1 *)(plVar18 + 2) = 0;
        glu::getBufferTargetName(0x8c8e);
        plVar18 = (long *)std::__cxx11::string::append(local_588);
        local_568 = (undefined1  [8])&local_558;
        paVar25 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)(plVar18 + 2);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*plVar18 == paVar25) {
          local_558._M_allocated_capacity = paVar25->_M_allocated_capacity;
          local_558._8_8_ = plVar18[3];
        }
        else {
          local_558._M_allocated_capacity = paVar25->_M_allocated_capacity;
          local_568 = (undefined1  [8])*plVar18;
        }
        local_560 = plVar18[1];
        *plVar18 = (long)paVar25;
        plVar18[1] = 0;
        *(undefined1 *)(plVar18 + 2) = 0;
        plVar18 = (long *)std::__cxx11::string::append(local_568);
        local_4b8._M_t._M_impl._0_8_ =
             &local_4b8._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
        puVar26 = (ulong *)(plVar18 + 2);
        if ((_Base_ptr *)*plVar18 == (_Base_ptr *)puVar26) {
          local_4b8._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)*puVar26;
          local_4b8._M_t._M_impl.super__Rb_tree_header._M_header._M_left = (_Base_ptr)plVar18[3];
        }
        else {
          local_4b8._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)*puVar26;
          local_4b8._M_t._M_impl._0_8_ = (_Base_ptr *)*plVar18;
        }
        local_4b8._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ = plVar18[1];
        *plVar18 = (long)puVar26;
        plVar18[1] = 0;
        *(undefined1 *)(plVar18 + 2) = 0;
        std::__cxx11::ostringstream::ostringstream((ostringstream *)local_3a8);
        std::ostream::operator<<((ostringstream *)local_3a8,uVar42 * 0x10);
        std::__cxx11::stringbuf::str();
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_3a8);
        std::ios_base::~ios_base(local_338);
        pqVar36 = (qpTestLog *)0xf;
        if ((_Base_ptr *)local_4b8._M_t._M_impl._0_8_ !=
            &local_4b8._M_t._M_impl.super__Rb_tree_header._M_header._M_parent) {
          pqVar36 = (qpTestLog *)local_4b8._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
        }
        pqVar1 = (qpTestLog *)
                 (CONCAT44(uStack_4dc,local_4e0) +
                 local_4b8._M_t._M_impl.super__Rb_tree_header._M_header._0_8_);
        if (pqVar36 < pqVar1) {
          TVar37.m_log = (qpTestLog *)0xf;
          if (local_4e8 != (undefined1  [8])&local_4d8) {
            TVar37.m_log = local_4d8.m_log;
          }
          if (TVar37.m_log < pqVar1) goto LAB_0145196a;
          puVar19 = (undefined8 *)
                    std::__cxx11::string::replace
                              ((ulong)local_4e8,0,(char *)0x0,local_4b8._M_t._M_impl._0_8_);
        }
        else {
LAB_0145196a:
          puVar19 = (undefined8 *)
                    std::__cxx11::string::_M_append((char *)&local_4b8,(ulong)local_4e8);
        }
        local_520._0_8_ = local_520 + 0x10;
        plVar18 = puVar19 + 2;
        if ((long *)*puVar19 == plVar18) {
          local_520._16_8_ = *plVar18;
          local_520._24_8_ = puVar19[3];
        }
        else {
          local_520._16_8_ = *plVar18;
          local_520._0_8_ = (long *)*puVar19;
        }
        local_520._8_8_ = puVar19[1];
        *puVar19 = plVar18;
        puVar19[1] = 0;
        *(char *)plVar18 = '\0';
        plVar18 = (long *)std::__cxx11::string::append(local_520);
        _local_208 = local_200 + 8;
        pTVar27 = (TestLog *)(plVar18 + 2);
        if ((TestLog *)*plVar18 == pTVar27) {
          local_1f8[0]._0_8_ = pTVar27->m_log;
          local_1f8[0]._8_8_ = plVar18[3];
        }
        else {
          local_1f8[0]._0_8_ = pTVar27->m_log;
          _local_208 = (pointer)*plVar18;
        }
        local_200 = (undefined1  [8])plVar18[1];
        *plVar18 = (long)pTVar27;
        plVar18[1] = 0;
        *(undefined1 *)(plVar18 + 2) = 0;
        glu::checkError(local_4c4,_local_208,
                        "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fTessellationTests.cpp"
                        ,0x10d);
        if ((TestLog *)_local_208 != (TestLog *)(local_200 + 8)) {
          operator_delete(_local_208,(ulong)(local_1f8[0]._M_allocated_capacity + 1));
        }
        if ((undefined1 *)local_520._0_8_ != local_520 + 0x10) {
          operator_delete((void *)local_520._0_8_,(ulong)(local_520._16_8_ + 1));
        }
        if (local_4e8 != (undefined1  [8])&local_4d8) {
          operator_delete((void *)local_4e8,
                          (ulong)&((_Rb_tree_impl<deqp::gles31::Functional::(anonymous_namespace)::VecLexLessThan<3>,_false>
                                    *)&(local_4d8.m_log)->flags)->field_0x1);
        }
        if ((_Base_ptr *)local_4b8._M_t._M_impl._0_8_ !=
            &local_4b8._M_t._M_impl.super__Rb_tree_header._M_header._M_parent) {
          operator_delete((void *)local_4b8._M_t._M_impl._0_8_,
                          (ulong)&((_Rb_tree_impl<deqp::gles31::Functional::(anonymous_namespace)::VecLexLessThan<3>,_false>
                                    *)&(local_4b8._M_t._M_impl.super__Rb_tree_header._M_header.
                                       _M_parent)->_M_color)->field_0x1);
        }
        if (local_568 != (undefined1  [8])&local_558) {
          operator_delete((void *)local_568,local_558._M_allocated_capacity + 1);
        }
        if (local_588 != (undefined1  [8])&local_578) {
          operator_delete((void *)local_588,local_578._M_allocated_capacity + 1);
        }
        if (local_540 != (undefined1  [8])local_530) {
          operator_delete((void *)local_540,CONCAT71(local_530._1_7_,local_530[0]) + 1);
        }
        if (lVar17 == 0) {
          pTVar22 = (TestError *)__cxa_allocate_exception(0x38);
          tcu::TestError::TestError
                    (pTVar22,(char *)0x0,"mappedData != DE_NULL",
                     "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fTessellationTests.cpp"
                     ,0x10e);
          __cxa_throw(pTVar22,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
        }
        if (0 < (int)uVar42) {
          lVar28 = 0;
          do {
            uVar35 = ((undefined8 *)(lVar17 + lVar28))[1];
            puVar19 = (undefined8 *)(lVar23 + lVar28);
            *puVar19 = *(undefined8 *)(lVar17 + lVar28);
            puVar19[1] = uVar35;
            lVar28 = lVar28 + 0x10;
          } while ((ulong)uVar42 << 4 != lVar28);
        }
        (**(code **)(lVar24 + 0x1670))(0x8c8e);
        local_428 = local_544;
        std::vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::vector
                  (&local_420,&local_488);
        this = local_228;
        pvVar8 = (void *)CONCAT62(local_488.
                                  super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                                  ._M_impl.super__Vector_impl_data._M_start._2_6_,
                                  local_488.
                                  super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                                  ._M_impl.super__Vector_impl_data._M_start._0_2_);
        if (pvVar8 != (void *)0x0) {
          operator_delete(pvVar8,(long)local_488.
                                       super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                                       ._M_impl.super__Vector_impl_data._M_end_of_storage -
                                 (long)pvVar8);
        }
        pfVar32 = local_468.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                  super__Vector_impl_data._M_start + 2;
        pfVar29 = local_468.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                  super__Vector_impl_data._M_start;
        uVar42 = referenceVertexCount
                           (this->m_primitiveType,this->m_spacing,this->m_usePointMode,
                            local_468.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                            super__Vector_impl_data._M_start,pfVar32);
        iVar15 = (int)pfVar32;
        iVar13 = (int)pfVar29;
        if (uVar42 == (uint)((ulong)((long)local_420.
                                           super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                                           ._M_impl.super__Vector_impl_data._M_finish -
                                    (long)local_420.
                                          super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                                          ._M_impl.super__Vector_impl_data._M_start) >> 4)) {
          iVar13 = 0;
          local_520._0_8_ = local_520._0_8_ & 0xffffffffffffff00;
          local_520._8_8_ = local_520._8_8_ & 0xffffffff00000000;
          local_520._16_8_ = (_Base_ptr)0x0;
          local_520._24_8_ = (_Base_ptr)(local_520 + 8);
          local_500 = (_Base_ptr)(local_520 + 8);
          local_4f8 = 0;
          local_4b8._M_t._M_impl._0_8_ = local_4b8._M_t._M_impl._0_8_ & 0xffffffffffffff00;
          local_4b8._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ =
               local_4b8._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ & 0xffffffff00000000;
          local_4b8._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
          local_4b8._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
               &local_4b8._M_t._M_impl.super__Rb_tree_header._M_header;
          local_4b8._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
               local_4b8._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
          local_4b8._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
          if (0 < (int)uVar42) {
            uVar43 = 0;
            lVar24 = local_448;
            do {
              pVVar11 = local_420.
                        super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                        ._M_impl.super__Vector_impl_data._M_start;
              pOVar9 = local_4f0;
              iVar13 = (int)uVar43 * 0x10;
              fVar3 = local_420.
                      super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                      ._M_impl.super__Vector_impl_data._M_start[uVar43].m_data[0];
              fVar4 = local_420.
                      super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                      ._M_impl.super__Vector_impl_data._M_start[uVar43].m_data[1];
              _local_3a8 = (qpTestLog *)CONCAT44(fVar4,fVar3);
              local_3a0._0_4_ =
                   local_420.
                   super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                   ._M_impl.super__Vector_impl_data._M_start[uVar43].m_data[2];
              uVar33 = (ulong)local_4f0->numConstantCoordinateValueChoices;
              bVar44 = 0 < (long)uVar33;
              if ((long)uVar33 < 1) {
LAB_01451cf8:
                if (bVar44) goto LAB_01451d01;
              }
              else {
                fVar5 = *(float *)(local_3a8 + (long)local_4f0->constantCoordinateIndex * 4);
                if ((fVar5 != local_4f0->constantCoordinateValueChoices[0]) ||
                   (NAN(fVar5) || NAN(local_4f0->constantCoordinateValueChoices[0]))) {
                  uVar38 = 1;
                  do {
                    uVar40 = uVar38;
                    if (uVar33 == uVar40) break;
                    pfVar2 = (float *)(lVar24 + -4 + uVar40 * 4);
                    uVar38 = uVar40 + 1;
                  } while ((fVar5 != *pfVar2) || (NAN(fVar5) || NAN(*pfVar2)));
                  bVar44 = uVar40 < uVar33;
                  goto LAB_01451cf8;
                }
LAB_01451d01:
                TVar6 = this->m_primitiveType;
                if (TVar6 == TESSPRIMITIVETYPE_TRIANGLES) {
                  local_560 = local_560 & 0xffffffff00000000;
                  local_568 = (undefined1  [8])0x0;
                  lVar23 = 0;
                  do {
                    *(undefined4 *)(local_588 + lVar23 * 4) = 0x3f000000;
                    lVar23 = lVar23 + 1;
                  } while (lVar23 != 3);
                  local_540 = (undefined1  [8])((ulong)local_540 & 0xffffffffff000000);
                  local_540[local_4f0->constantCoordinateIndex] = 1;
                  _local_208 = (pointer)0x0;
                  local_200 = (undefined1  [8])((ulong)local_200 & 0xffffffff00000000);
                  puVar21 = (undefined4 *)local_568;
                  lVar23 = 0;
                  puVar20 = (undefined4 *)local_588;
                  do {
                    puVar39 = puVar21;
                    if (local_540[lVar23] == '\0') {
                      puVar39 = puVar20;
                    }
                    *(undefined4 *)(local_208 + lVar23 * 4) = *puVar39;
                    lVar23 = lVar23 + 1;
                    puVar20 = puVar20 + 1;
                    puVar21 = puVar21 + 1;
                  } while (lVar23 != 3);
                  pfVar32 = (float *)0x3;
                  if (((float)local_3a8 == (float)local_208) &&
                     (!NAN((float)local_3a8) && !NAN((float)local_208))) {
                    uVar33 = 0;
                    while (uVar38 = uVar33, uVar38 != 2) {
                      if ((*(float *)(local_3a8 + uVar38 * 4 + 4) !=
                           *(float *)(local_208 + uVar38 * 4 + 4)) ||
                         (uVar33 = uVar38 + 1,
                         NAN(*(float *)(local_3a8 + uVar38 * 4 + 4)) ||
                         NAN(*(float *)(local_208 + uVar38 * 4 + 4)))) break;
                    }
                    if (1 < uVar38) goto LAB_01451ffb;
                  }
                }
                if (TVar6 == TESSPRIMITIVETYPE_QUADS) {
                  fVar5 = pOVar9->constantCoordinateValueChoices[0];
                  lVar23 = 0;
                  do {
                    *(float *)(local_568 + lVar23 * 4) = fVar5;
                    lVar23 = lVar23 + 1;
                  } while (lVar23 == 1);
                  lVar23 = 0;
                  do {
                    *(undefined4 *)(local_588 + lVar23 * 4) = 0x3f000000;
                    lVar23 = lVar23 + 1;
                  } while (lVar23 == 1);
                  local_540 = (undefined1  [8])((ulong)local_540 & 0xffffffffffff0000);
                  local_540[pOVar9->constantCoordinateIndex] = 1;
                  _local_208 = (pointer)0x0;
                  puVar21 = (undefined4 *)local_568;
                  pfVar32 = (float *)0x0;
                  puVar20 = (undefined4 *)local_588;
                  do {
                    puVar39 = puVar21;
                    if (local_540[(long)pfVar32] == '\0') {
                      puVar39 = puVar20;
                    }
                    *(undefined4 *)(local_208 + (long)pfVar32 * 4) = *puVar39;
                    pfVar32 = (float *)((long)pfVar32 + 1);
                    puVar20 = puVar20 + 1;
                    puVar21 = puVar21 + 1;
                  } while (pfVar32 == (float *)&DAT_00000001);
                  if ((fVar3 == (float)local_208) && (!NAN(fVar3) && !NAN((float)local_208))) {
                    bVar44 = true;
                    do {
                      bVar12 = bVar44;
                      if (!bVar12) goto LAB_01451ffb;
                    } while ((fVar4 == fStack_204) &&
                            (bVar44 = false, !NAN(fVar4) && !NAN(fStack_204)));
                    if (!bVar12) goto LAB_01451ffb;
                  }
                }
                if (TVar6 == TESSPRIMITIVETYPE_ISOLINES) {
                  _local_208 = (pointer)0x3f00000000000000;
                  local_200 = (undefined1  [8])((ulong)local_200 & 0xffffffff00000000);
                  if (((float)local_3a8 == 0.0) && (!NAN((float)local_3a8))) {
                    uVar33 = 0;
                    while (uVar38 = uVar33, uVar38 != 2) {
                      if ((*(float *)(local_3a8 + uVar38 * 4 + 4) !=
                           *(float *)(local_208 + uVar38 * 4 + 4)) ||
                         (uVar33 = uVar38 + 1,
                         NAN(*(float *)(local_3a8 + uVar38 * 4 + 4)) ||
                         NAN(*(float *)(local_208 + uVar38 * 4 + 4)))) break;
                    }
                    if (1 < uVar38) goto LAB_01451ffb;
                  }
                  local_568 = (undefined1  [8])0x3f0000003f800000;
                  local_560 = local_560 & 0xffffffff00000000;
                  if (((float)local_3a8 == 1.0) && (!NAN((float)local_3a8))) {
                    uVar33 = 0;
                    while (uVar38 = uVar33, uVar38 != 2) {
                      if ((*(float *)(local_3a8 + uVar38 * 4 + 4) !=
                           *(float *)(local_568 + uVar38 * 4 + 4)) ||
                         (uVar33 = uVar38 + 1,
                         NAN(*(float *)(local_3a8 + uVar38 * 4 + 4)) ||
                         NAN(*(float *)(local_568 + uVar38 * 4 + 4)))) break;
                    }
                    if (1 < uVar38) goto LAB_01451ffb;
                  }
                  local_588 = (undefined1  [8])0x0;
                  local_580 = local_580 & 0xffffffff00000000;
                  if (((float)local_3a8 == 0.0) && (!NAN((float)local_3a8))) {
                    uVar33 = 0;
                    while (uVar38 = uVar33, uVar38 != 2) {
                      if ((*(float *)(local_3a8 + uVar38 * 4 + 4) !=
                           *(float *)(local_588 + uVar38 * 4 + 4)) ||
                         (uVar33 = uVar38 + 1,
                         NAN(*(float *)(local_3a8 + uVar38 * 4 + 4)) ||
                         NAN(*(float *)(local_588 + uVar38 * 4 + 4)))) break;
                    }
                    if (1 < uVar38) goto LAB_01451ffb;
                  }
                  local_540 = (undefined1  [8])0x3f800000;
                  local_538 = local_538 & 0xffffffff00000000;
                  if (((float)local_3a8 == 1.0) && (!NAN((float)local_3a8))) {
                    uVar33 = 0;
                    while (uVar38 = uVar33, uVar38 != 2) {
                      if ((*(float *)(local_3a8 + uVar38 * 4 + 4) !=
                           *(float *)(local_540 + uVar38 * 4 + 4)) ||
                         (uVar33 = uVar38 + 1,
                         NAN(*(float *)(local_3a8 + uVar38 * 4 + 4)) ||
                         NAN(*(float *)(local_540 + uVar38 * 4 + 4)))) break;
                    }
                    if (1 < uVar38) goto LAB_01451ffb;
                  }
                }
                this_00 = (set<tcu::Vector<float,_3>,_deqp::gles31::Functional::(anonymous_namespace)::VecLexLessThan<3>,_std::allocator<tcu::Vector<float,_3>_>_>
                           *)local_520;
                if (0.5 < pVVar11[uVar43].m_data[3]) {
                  this_00 = &local_4b8;
                }
                std::
                set<tcu::Vector<float,_3>,_deqp::gles31::Functional::(anonymous_namespace)::VecLexLessThan<3>,_std::allocator<tcu::Vector<float,_3>_>_>
                ::insert(this_00,(value_type *)local_3a8);
                lVar24 = local_448;
              }
LAB_01451ffb:
              iVar15 = (int)pfVar32;
              uVar43 = uVar43 + 1;
            } while (uVar43 != uVar42);
          }
          pOVar9 = local_4f0;
          TVar6 = this->m_primitiveType;
          if (TVar6 == TESSPRIMITIVETYPE_ISOLINES) {
LAB_01452709:
            if (local_4f8 != local_4b8._M_t._M_impl.super__Rb_tree_header._M_node_count) {
LAB_01452740:
              _local_208 = (pointer)local_4c0;
              std::__cxx11::ostringstream::ostringstream((ostringstream *)local_200);
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)local_200,
                         "Failure: the set of mirrored edges isn\'t equal to the set of non-mirrored edges (ignoring endpoints and possible middle)"
                         ,0x78);
              _local_3a8 = (qpTestLog *)
                           tcu::MessageBuilder::operator<<
                                     ((MessageBuilder *)local_208,
                                      (EndMessageToken *)&tcu::TestLog::EndMessage);
              std::__cxx11::ostringstream::ostringstream((ostringstream *)local_3a0);
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)local_3a0,"Note: non-mirrored vertices:\n",0x1d);
              containerStr<std::set<tcu::Vector<float,3>,deqp::gles31::Functional::(anonymous_namespace)::VecLexLessThan<3>,std::allocator<tcu::Vector<float,3>>>>
                        ((string *)local_568,(Functional *)local_520,
                         (set<tcu::Vector<float,_3>,_deqp::gles31::Functional::(anonymous_namespace)::VecLexLessThan<3>,_std::allocator<tcu::Vector<float,_3>_>_>
                          *)0x0,iVar13,iVar15);
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)local_3a0,(char *)local_568,local_560);
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)local_3a0,"\nmirrored vertices:\n",0x14);
              containerStr<std::set<tcu::Vector<float,3>,deqp::gles31::Functional::(anonymous_namespace)::VecLexLessThan<3>,std::allocator<tcu::Vector<float,3>>>>
                        ((string *)local_588,(Functional *)&local_4b8,
                         (set<tcu::Vector<float,_3>,_deqp::gles31::Functional::(anonymous_namespace)::VecLexLessThan<3>,_std::allocator<tcu::Vector<float,_3>_>_>
                          *)0x0,iVar13,iVar15);
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)local_3a0,(char *)local_588,local_580);
              tcu::MessageBuilder::operator<<
                        ((MessageBuilder *)local_3a8,(EndMessageToken *)&tcu::TestLog::EndMessage);
              if (local_588 != (undefined1  [8])&local_578) {
                operator_delete((void *)local_588,local_578._M_allocated_capacity + 1);
              }
              if (local_568 != (undefined1  [8])&local_558) {
                operator_delete((void *)local_568,local_558._M_allocated_capacity + 1);
              }
              std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_3a0);
              std::ios_base::~ios_base(local_330);
              std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_200);
              std::ios_base::~ios_base(local_190);
              __last1._M_node = (_Base_ptr)&DAT_00000001;
              tcu::TestContext::setTestResult
                        ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx,
                         QP_TEST_RESULT_FAIL,"Invalid set of vertices");
              goto LAB_01452a51;
            }
            __last1._M_node = (_Base_ptr)(local_520 + 8);
            bVar12 = std::__equal<false>::
                     equal<std::_Rb_tree_const_iterator<tcu::Vector<float,3>>,std::_Rb_tree_const_iterator<tcu::Vector<float,3>>>
                               ((_Rb_tree_const_iterator<tcu::Vector<float,_3>_>)local_520._24_8_,
                                __last1,(_Rb_tree_const_iterator<tcu::Vector<float,_3>_>)
                                        local_4b8._M_t._M_impl.super__Rb_tree_header._M_header.
                                        _M_left);
            bVar44 = true;
            if (!bVar12) goto LAB_01452740;
          }
          else {
            local_538 = local_538 & 0xffffffff00000000;
            local_540 = (undefined1  [8])0x0;
            local_4e0 = 0.0;
            local_4e8 = (undefined1  [8])0x0;
            if (TVar6 == TESSPRIMITIVETYPE_QUADS) {
              fVar3 = local_4f0->constantCoordinateValueChoices[0];
              lVar24 = 0;
              do {
                *(float *)(local_568 + lVar24 * 4) = fVar3;
                lVar24 = lVar24 + 1;
              } while (lVar24 == 1);
              local_588 = (undefined1  [8])0x0;
              iVar13 = local_4f0->constantCoordinateIndex;
              local_488.
              super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
              _M_impl.super__Vector_impl_data._M_start._0_2_ = 0;
              *(undefined1 *)
               ((long)&local_488.
                       super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                       ._M_impl.super__Vector_impl_data._M_start + (long)iVar13) = 1;
              _local_208 = (pointer)0x0;
              puVar21 = (undefined4 *)local_568;
              lVar24 = 0;
              puVar20 = (undefined4 *)local_588;
              do {
                puVar39 = puVar21;
                if (*(char *)((long)&local_488.
                                     super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                                     ._M_impl.super__Vector_impl_data._M_start + lVar24) == '\0') {
                  puVar39 = puVar20;
                }
                *(undefined4 *)(local_208 + lVar24 * 4) = *puVar39;
                lVar24 = lVar24 + 1;
                puVar20 = puVar20 + 1;
                puVar21 = puVar21 + 1;
              } while (lVar24 == 1);
              _local_3a8 = (qpTestLog *)local_540;
              local_3a0 = (undefined1  [8])0x100000000;
              lVar24 = 0;
              do {
                *(undefined4 *)(local_540 + (long)*(int *)(local_3a0 + lVar24 * 4) * 4) =
                     *(undefined4 *)(local_208 + lVar24 * 4);
                lVar24 = lVar24 + 1;
              } while (lVar24 == 1);
              fVar3 = pOVar9->constantCoordinateValueChoices[0];
              lVar24 = 0;
              do {
                *(float *)(local_568 + lVar24 * 4) = fVar3;
                lVar24 = lVar24 + 1;
              } while (lVar24 == 1);
              lVar24 = 0;
              do {
                *(undefined4 *)(local_588 + lVar24 * 4) = 0x3f800000;
                lVar24 = lVar24 + 1;
              } while (lVar24 == 1);
              local_488.
              super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
              _M_impl.super__Vector_impl_data._M_start._0_2_ = 0;
              *(undefined1 *)
               ((long)&local_488.
                       super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                       ._M_impl.super__Vector_impl_data._M_start + (long)iVar13) = 1;
              _local_208 = (pointer)0x0;
              puVar21 = (undefined4 *)local_568;
              lVar24 = 0;
              puVar20 = (undefined4 *)local_588;
              do {
                puVar39 = puVar21;
                if (*(char *)((long)&local_488.
                                     super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                                     ._M_impl.super__Vector_impl_data._M_start + lVar24) == '\0') {
                  puVar39 = puVar20;
                }
                *(undefined4 *)(local_208 + lVar24 * 4) = *puVar39;
                lVar24 = lVar24 + 1;
                puVar20 = puVar20 + 1;
                puVar21 = puVar21 + 1;
              } while (lVar24 == 1);
              _local_3a8 = (qpTestLog *)local_4e8;
              local_3a0 = (undefined1  [8])0x100000000;
              lVar24 = 0;
              do {
                *(undefined4 *)((long)local_4e8 + (long)*(int *)(local_3a0 + lVar24 * 4) * 4) =
                     *(undefined4 *)(local_208 + lVar24 * 4);
                lVar24 = lVar24 + 1;
              } while (lVar24 == 1);
            }
            else if (TVar6 == TESSPRIMITIVETYPE_TRIANGLES) {
              lVar24 = 0;
              do {
                *(undefined4 *)(local_208 + lVar24 * 4) = 0x3f800000;
                lVar24 = lVar24 + 1;
              } while (lVar24 != 3);
              local_560 = local_560 & 0xffffffff00000000;
              local_568 = (undefined1  [8])0x0;
              local_588 = (undefined1  [8])((ulong)local_588 & 0xffffffffff000000);
              local_588[local_4f0->constantCoordinateIndex +
                        ((local_4f0->constantCoordinateIndex + 1) / 3) * -3 + 1] = 1;
              _local_3a8 = (qpTestLog *)0x0;
              local_3a0 = (undefined1  [8])((ulong)local_3a0 & 0xffffffff00000000);
              puVar20 = (undefined4 *)local_208;
              puVar21 = (undefined4 *)local_568;
              lVar24 = 0;
              do {
                puVar39 = puVar20;
                if (local_588[lVar24] == '\0') {
                  puVar39 = puVar21;
                }
                *(undefined4 *)(local_3a8 + lVar24 * 4) = *puVar39;
                lVar24 = lVar24 + 1;
                puVar21 = puVar21 + 1;
                puVar20 = puVar20 + 1;
              } while (lVar24 != 3);
              local_538 = CONCAT44(local_538._4_4_,local_3a0._0_4_);
              local_540 = (undefined1  [8])_local_3a8;
              lVar24 = 0;
              do {
                *(undefined4 *)(local_208 + lVar24 * 4) = 0x3f800000;
                lVar24 = lVar24 + 1;
              } while (lVar24 != 3);
              local_560 = local_560 & 0xffffffff00000000;
              local_568 = (undefined1  [8])0x0;
              iVar13 = pOVar9->constantCoordinateIndex;
              local_588 = (undefined1  [8])((ulong)local_588 & 0xffffffffff000000);
              local_588[iVar13 + ((iVar13 + 2) / 3) * -3 + 2] = 1;
              _local_3a8 = (qpTestLog *)0x0;
              local_3a0 = (undefined1  [8])((ulong)local_3a0 & 0xffffffff00000000);
              puVar20 = (undefined4 *)local_208;
              puVar21 = (undefined4 *)local_568;
              lVar24 = 0;
              do {
                puVar39 = puVar20;
                if (local_588[lVar24] == '\0') {
                  puVar39 = puVar21;
                }
                *(undefined4 *)(local_3a8 + lVar24 * 4) = *puVar39;
                lVar24 = lVar24 + 1;
                puVar21 = puVar21 + 1;
                puVar20 = puVar20 + 1;
              } while (lVar24 != 3);
              local_4e0 = (float)local_3a0._0_4_;
              local_4e8 = (undefined1  [8])_local_3a8;
            }
            p_Var41 = (_Base_ptr)(local_520 + 8);
            p_Var30 = p_Var41;
            for (p_Var34 = (_Base_ptr)local_520._16_8_; p_Var34 != (_Base_ptr)0x0;
                p_Var34 = (&p_Var34->_M_left)[bVar31]) {
              bVar31 = 1;
              if ((float)local_540._0_4_ <= *(float *)(p_Var34 + 1)) {
                if (*(float *)(p_Var34 + 1) <= (float)local_540._0_4_) {
                  uVar43 = 0;
                  do {
                    uVar33 = uVar43;
                    if (uVar33 == 2) {
                      uVar33 = 2;
                      bVar31 = 2;
                      goto LAB_0145255f;
                    }
                    fVar3 = *(float *)((long)(p_Var34 + 1) + uVar33 * 4 + 4);
                    if (fVar3 < *(float *)(local_540 + uVar33 * 4 + 4)) {
                      bVar31 = 1;
                      goto LAB_0145255f;
                    }
                    uVar43 = uVar33 + 1;
                  } while (fVar3 <= *(float *)(local_540 + uVar33 * 4 + 4));
                  bVar31 = 0;
LAB_0145255f:
                  bVar31 = uVar33 < 2 & bVar31;
                }
                else {
                  bVar31 = 0;
                }
              }
              if (bVar31 == 0) {
                p_Var30 = p_Var34;
              }
            }
            p_Var34 = p_Var41;
            if (((p_Var30 != p_Var41) && ((float)p_Var30[1]._M_color <= (float)local_540._0_4_)) &&
               (p_Var34 = p_Var30, (float)local_540._0_4_ <= (float)p_Var30[1]._M_color)) {
              uVar43 = 0;
              do {
                uVar33 = uVar43;
                if (uVar33 == 2) {
                  uVar33 = 2;
                  bVar44 = false;
                  goto LAB_014525d7;
                }
                if (*(float *)(local_540 + uVar33 * 4 + 4) <
                    *(float *)(&p_Var30[1].field_0x4 + uVar33 * 4)) {
                  bVar44 = true;
                  goto LAB_014525d7;
                }
                uVar43 = uVar33 + 1;
              } while (*(float *)(local_540 + uVar33 * 4 + 4) <=
                       *(float *)(&p_Var30[1].field_0x4 + uVar33 * 4));
              bVar44 = false;
LAB_014525d7:
              if (bVar44) {
                p_Var34 = p_Var41;
              }
              if (1 < uVar33) {
                p_Var34 = p_Var30;
              }
            }
            if (p_Var34 != p_Var41) {
              p_Var30 = p_Var41;
              for (p_Var34 = (_Base_ptr)local_520._16_8_; p_Var34 != (_Base_ptr)0x0;
                  p_Var34 = (&p_Var34->_M_left)[bVar31]) {
                bVar31 = 1;
                if ((float)local_4e8._0_4_ <= (float)p_Var34[1]._M_color) {
                  if ((float)p_Var34[1]._M_color <= (float)local_4e8._0_4_) {
                    uVar43 = 0;
                    do {
                      uVar33 = uVar43;
                      if (uVar33 == 2) {
                        uVar33 = 2;
                        bVar31 = 2;
                        goto LAB_01452652;
                      }
                      fVar3 = *(float *)((long)local_4e8 + uVar33 * 4 + 4);
                      if (*(float *)(&p_Var34[1].field_0x4 + uVar33 * 4) < fVar3) {
                        bVar31 = 1;
                        goto LAB_01452652;
                      }
                      uVar43 = uVar33 + 1;
                    } while (*(float *)(&p_Var34[1].field_0x4 + uVar33 * 4) <= fVar3);
                    bVar31 = 0;
LAB_01452652:
                    bVar31 = uVar33 < 2 & bVar31;
                  }
                  else {
                    bVar31 = 0;
                  }
                }
                if (bVar31 == 0) {
                  p_Var30 = p_Var34;
                }
              }
              p_Var34 = p_Var41;
              if (((p_Var30 != p_Var41) && ((float)p_Var30[1]._M_color <= (float)local_4e8._0_4_))
                 && (p_Var34 = p_Var30, (float)local_4e8._0_4_ <= (float)p_Var30[1]._M_color)) {
                uVar43 = 0;
                do {
                  uVar33 = uVar43;
                  if (uVar33 == 2) {
                    uVar33 = 2;
                    bVar44 = false;
                    goto LAB_014526cc;
                  }
                  fVar3 = *(float *)((long)local_4e8 + uVar33 * 4 + 4);
                  if (fVar3 < *(float *)(&p_Var30[1].field_0x4 + uVar33 * 4)) {
                    bVar44 = true;
                    goto LAB_014526cc;
                  }
                  uVar43 = uVar33 + 1;
                } while (fVar3 <= *(float *)(&p_Var30[1].field_0x4 + uVar33 * 4));
                bVar44 = false;
LAB_014526cc:
                if (bVar44) {
                  p_Var34 = p_Var41;
                }
                if (1 < uVar33) {
                  p_Var34 = p_Var30;
                }
              }
              if (p_Var34 != p_Var41) {
                std::
                set<tcu::Vector<float,_3>,_deqp::gles31::Functional::(anonymous_namespace)::VecLexLessThan<3>,_std::allocator<tcu::Vector<float,_3>_>_>
                ::erase((set<tcu::Vector<float,_3>,_deqp::gles31::Functional::(anonymous_namespace)::VecLexLessThan<3>,_std::allocator<tcu::Vector<float,_3>_>_>
                         *)local_520,(key_type *)local_540);
                iVar15 = (int)p_Var41;
                iVar13 = (int)p_Var30;
                std::
                set<tcu::Vector<float,_3>,_deqp::gles31::Functional::(anonymous_namespace)::VecLexLessThan<3>,_std::allocator<tcu::Vector<float,_3>_>_>
                ::erase((set<tcu::Vector<float,_3>,_deqp::gles31::Functional::(anonymous_namespace)::VecLexLessThan<3>,_std::allocator<tcu::Vector<float,_3>_>_>
                         *)local_520,(key_type *)local_4e8);
                goto LAB_01452709;
              }
            }
            iVar13 = (int)p_Var30;
            _local_208 = (pointer)local_4c0;
            std::__cxx11::ostringstream::ostringstream((ostringstream *)local_200);
            iVar15 = (int)p_Var41;
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)local_200,"Failure: edge doesn\'t contain both endpoints, ",0x2e);
            tcu::operator<<((ostream *)local_200,(Vector<float,_3> *)local_540);
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_200," and ",5);
            tcu::operator<<((ostream *)local_200,(Vector<float,_3> *)local_4e8);
            _local_3a8 = (qpTestLog *)
                         tcu::MessageBuilder::operator<<
                                   ((MessageBuilder *)local_208,
                                    (EndMessageToken *)&tcu::TestLog::EndMessage);
            std::__cxx11::ostringstream::ostringstream((ostringstream *)local_3a0);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)local_3a0,"Note: non-mirrored vertices:\n",0x1d);
            containerStr<std::set<tcu::Vector<float,3>,deqp::gles31::Functional::(anonymous_namespace)::VecLexLessThan<3>,std::allocator<tcu::Vector<float,3>>>>
                      ((string *)local_568,(Functional *)local_520,
                       (set<tcu::Vector<float,_3>,_deqp::gles31::Functional::(anonymous_namespace)::VecLexLessThan<3>,_std::allocator<tcu::Vector<float,_3>_>_>
                        *)0x0,iVar13,iVar15);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)local_3a0,(char *)local_568,local_560);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)local_3a0,"\nmirrored vertices:\n",0x14);
            containerStr<std::set<tcu::Vector<float,3>,deqp::gles31::Functional::(anonymous_namespace)::VecLexLessThan<3>,std::allocator<tcu::Vector<float,3>>>>
                      ((string *)local_588,(Functional *)&local_4b8,
                       (set<tcu::Vector<float,_3>,_deqp::gles31::Functional::(anonymous_namespace)::VecLexLessThan<3>,_std::allocator<tcu::Vector<float,_3>_>_>
                        *)0x0,iVar13,iVar15);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)local_3a0,(char *)local_588,local_580);
            tcu::MessageBuilder::operator<<
                      ((MessageBuilder *)local_3a8,(EndMessageToken *)&tcu::TestLog::EndMessage);
            if (local_588 != (undefined1  [8])&local_578) {
              operator_delete((void *)local_588,local_578._M_allocated_capacity + 1);
            }
            if (local_568 != (undefined1  [8])&local_558) {
              operator_delete((void *)local_568,local_558._M_allocated_capacity + 1);
            }
            std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_3a0);
            std::ios_base::~ios_base(local_330);
            std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_200);
            std::ios_base::~ios_base(local_190);
            __last1._M_node = (_Base_ptr)&DAT_00000001;
            tcu::TestContext::setTestResult
                      ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx,
                       QP_TEST_RESULT_FAIL,"Invalid set of vertices");
LAB_01452a51:
            bVar44 = false;
          }
          std::
          _Rb_tree<tcu::Vector<float,_3>,_tcu::Vector<float,_3>,_std::_Identity<tcu::Vector<float,_3>_>,_deqp::gles31::Functional::(anonymous_namespace)::VecLexLessThan<3>,_std::allocator<tcu::Vector<float,_3>_>_>
          ::_M_erase((_Rb_tree<tcu::Vector<float,_3>,_tcu::Vector<float,_3>,_std::_Identity<tcu::Vector<float,_3>_>,_deqp::gles31::Functional::(anonymous_namespace)::VecLexLessThan<3>,_std::allocator<tcu::Vector<float,_3>_>_>
                      *)local_4b8._M_t._M_impl.super__Rb_tree_header._M_header._M_parent,
                     (_Link_type)__last1._M_node);
          std::
          _Rb_tree<tcu::Vector<float,_3>,_tcu::Vector<float,_3>,_std::_Identity<tcu::Vector<float,_3>_>,_deqp::gles31::Functional::(anonymous_namespace)::VecLexLessThan<3>,_std::allocator<tcu::Vector<float,_3>_>_>
          ::_M_erase((_Rb_tree<tcu::Vector<float,_3>,_tcu::Vector<float,_3>,_std::_Identity<tcu::Vector<float,_3>_>,_deqp::gles31::Functional::(anonymous_namespace)::VecLexLessThan<3>,_std::allocator<tcu::Vector<float,_3>_>_>
                      *)local_520._16_8_,(_Link_type)__last1._M_node);
          uVar35 = extraout_RDX_00;
        }
        else {
          _local_208 = (pointer)local_4c0;
          std::__cxx11::ostringstream::ostringstream((ostringstream *)local_200);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_200,
                     "Failure: the number of vertices returned by transform feedback is ",0x42);
          std::ostream::_M_insert<unsigned_long>((ulong)local_200);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_200,", expected ",0xb)
          ;
          std::ostream::operator<<(local_200,uVar42);
          _local_3a8 = (qpTestLog *)
                       tcu::MessageBuilder::operator<<
                                 ((MessageBuilder *)local_208,
                                  (EndMessageToken *)&tcu::TestLog::EndMessage);
          std::__cxx11::ostringstream::ostringstream((ostringstream *)local_3a0);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_3a0,
                     "Note: rendered 1 patch, tessellation levels are (in order [inner0, inner1, outer0, outer1, outer2, outer3]):\n"
                     ,0x6d);
          containerStr<std::vector<float,std::allocator<float>>>
                    ((string *)local_520,(Functional *)&local_468,
                     (vector<float,_std::allocator<float>_> *)0x6,iVar13,iVar15);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_3a0,(char *)local_520._0_8_,local_520._8_8_);
          tcu::MessageBuilder::operator<<
                    ((MessageBuilder *)local_3a8,(EndMessageToken *)&tcu::TestLog::EndMessage);
          if ((undefined1 *)local_520._0_8_ != local_520 + 0x10) {
            operator_delete((void *)local_520._0_8_,(ulong)(local_520._16_8_ + 1));
          }
          std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_3a0);
          std::ios_base::~ios_base(local_330);
          std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_200);
          std::ios_base::~ios_base(local_190);
          tcu::TestContext::setTestResult
                    ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx,
                     QP_TEST_RESULT_FAIL,"Invalid set of vertices");
          bVar44 = false;
          uVar35 = extraout_RDX;
        }
        if (local_420.
            super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
            _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
          operator_delete(local_420.
                          super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                          ._M_impl.super__Vector_impl_data._M_start,
                          (long)local_420.
                                super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                                ._M_impl.super__Vector_impl_data._M_end_of_storage -
                          (long)local_420.
                                super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                                ._M_impl.super__Vector_impl_data._M_start);
          uVar35 = extraout_RDX_01;
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_80._M_p != &local_70) {
          operator_delete(local_80._M_p,local_70._M_allocated_capacity + 1);
          uVar35 = extraout_RDX_02;
        }
        if (local_468.super__Vector_base<float,_std::allocator<float>_>._M_impl.
            super__Vector_impl_data._M_start != (float *)0x0) {
          operator_delete(local_468.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                          super__Vector_impl_data._M_start,
                          (long)local_468.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                                super__Vector_impl_data._M_end_of_storage -
                          (long)local_468.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                                super__Vector_impl_data._M_start);
          uVar35 = extraout_RDX_03;
        }
        if (!bVar44) {
          bVar44 = true;
          uVar33 = local_218;
          goto LAB_01452b4f;
        }
        uVar43 = local_210 + 1;
        uVar33 = CONCAT71((int7)((ulong)uVar35 >> 8),10 < local_210);
      } while (uVar43 != 0xc);
      bVar44 = false;
LAB_01452b4f:
      if ((uVar33 & 1) == 0) goto LAB_01452b82;
      lVar23 = local_470 + 1;
      lVar24 = local_450 + 0x10;
    } while (lVar23 < (int)((ulong)((long)local_440.
                                          super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::OuterEdgeDescription,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::OuterEdgeDescription>_>
                                          ._M_impl.super__Vector_impl_data._M_finish -
                                   (long)local_440.
                                         super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::OuterEdgeDescription,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::OuterEdgeDescription>_>
                                         ._M_impl.super__Vector_impl_data._M_start) >> 4));
    bVar44 = false;
LAB_01452b82:
    glu::ObjectWrapper::~ObjectWrapper(&local_3c0);
    glu::ObjectWrapper::~ObjectWrapper(&local_3d8);
    glu::ObjectWrapper::~ObjectWrapper(&local_3f0);
    if (bVar44) goto LAB_01452be9;
  }
  tcu::TestContext::setTestResult
            ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx,QP_TEST_RESULT_PASS,
             "Pass");
LAB_01452be9:
  if (local_440.
      super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::OuterEdgeDescription,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::OuterEdgeDescription>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_440.
                    super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::OuterEdgeDescription,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::OuterEdgeDescription>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_440.
                          super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::OuterEdgeDescription,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::OuterEdgeDescription>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_440.
                          super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::OuterEdgeDescription,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::OuterEdgeDescription>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  return STOP;
}

Assistant:

SymmetricOuterEdgeCase::IterateResult SymmetricOuterEdgeCase::iterate (void)
{
	typedef TransformFeedbackHandler<Vec4> TFHandler;

	TestLog&							log							= m_testCtx.getLog();
	const RenderContext&				renderCtx					= m_context.getRenderContext();
	const RandomViewport				viewport					(renderCtx.getRenderTarget(), RENDER_SIZE, RENDER_SIZE, deStringHash(getName()));
	const glw::Functions&				gl							= renderCtx.getFunctions();

	static const float					singleOuterEdgeLevels[]		= { 1.0f, 1.2f, 1.9f, 2.3f, 2.8f, 3.3f, 3.8f, 10.2f, 1.6f, 24.4f, 24.7f, 63.0f };
	const vector<OuterEdgeDescription>	edgeDescriptions			= outerEdgeDescriptions(m_primitiveType);

	{
		// Compute the number vertices in the largest draw call, so we can allocate the TF buffer just once.
		int maxNumVerticesInDrawCall;
		{
			const vector<float> patchTessLevels = generatePatchTessLevels(1, 0 /* outer-edge index doesn't affect vertex count */, arrayMax(singleOuterEdgeLevels));
			maxNumVerticesInDrawCall = referenceVertexCount(m_primitiveType, m_spacing, m_usePointMode, &patchTessLevels[0], &patchTessLevels[2]);
		}

		{
			const TFHandler tfHandler(m_context.getRenderContext(), maxNumVerticesInDrawCall);

			setViewport(gl, viewport);
			gl.patchParameteri(GL_PATCH_VERTICES, 6);

			for (int outerEdgeIndex = 0; outerEdgeIndex < (int)edgeDescriptions.size(); outerEdgeIndex++)
			{
				const OuterEdgeDescription& edgeDesc = edgeDescriptions[outerEdgeIndex];

				for (int outerEdgeLevelCaseNdx = 0; outerEdgeLevelCaseNdx < DE_LENGTH_OF_ARRAY(singleOuterEdgeLevels); outerEdgeLevelCaseNdx++)
				{
					typedef std::set<Vec3, VecLexLessThan<3> > Vec3Set;

					const vector<float>				patchTessLevels		= generatePatchTessLevels(1, outerEdgeIndex, singleOuterEdgeLevels[outerEdgeLevelCaseNdx]);
					const glu::VertexArrayBinding	bindings[]			= { glu::va::Float("in_v_attr", 1, (int)patchTessLevels.size(), 0, &patchTessLevels[0]) };

					log << TestLog::Message << "Testing with outer tessellation level " << singleOuterEdgeLevels[outerEdgeLevelCaseNdx]
											<< " for the " << edgeDesc.description() << " edge, and with various levels for other edges" << TestLog::EndMessage;

					{
						const deUint32 programGL = m_program->getProgram();

						gl.useProgram(programGL);

						{
							const TFHandler::Result		tfResult		= tfHandler.renderAndGetPrimitives(programGL, outputPrimitiveTypeGL(m_primitiveType, m_usePointMode),
																										   DE_LENGTH_OF_ARRAY(bindings), &bindings[0], (int)patchTessLevels.size());
							const int					refNumVertices	= referenceVertexCount(m_primitiveType, m_spacing, m_usePointMode, &patchTessLevels[0], &patchTessLevels[2]);

							if ((int)tfResult.varying.size() != refNumVertices)
							{
								log << TestLog::Message << "Failure: the number of vertices returned by transform feedback is "
														<< tfResult.varying.size() << ", expected " << refNumVertices << TestLog::EndMessage
									<< TestLog::Message << "Note: rendered 1 patch, tessellation levels are (in order [inner0, inner1, outer0, outer1, outer2, outer3]):\n"
														<< containerStr(patchTessLevels, 6) << TestLog::EndMessage;

								m_testCtx.setTestResult(QP_TEST_RESULT_FAIL, "Invalid set of vertices");
								return STOP;
							}

							// Check the vertices.

							{
								Vec3Set nonMirroredEdgeVertices;
								Vec3Set mirroredEdgeVertices;

								// We're interested in just the vertices on the current outer edge.
								for(int vtxNdx = 0; vtxNdx < refNumVertices; vtxNdx++)
								{
									const Vec3& vtx = tfResult.varying[vtxNdx].swizzle(0,1,2);
									if (edgeDesc.contains(vtx))
									{
										// Ignore the middle vertex of the outer edge, as it's exactly at the mirroring point;
										// for isolines, also ignore (0, 0) and (1, 0) because there's no mirrored counterpart for them.
										if (m_primitiveType == TESSPRIMITIVETYPE_TRIANGLES && vtx == tcu::select(Vec3(0.0f), Vec3(0.5f), singleTrueMask<3>(edgeDesc.constantCoordinateIndex)))
											continue;
										if (m_primitiveType == TESSPRIMITIVETYPE_QUADS && vtx.swizzle(0,1) == tcu::select(Vec2(edgeDesc.constantCoordinateValueChoices[0]),
																															   Vec2(0.5f),
																															   singleTrueMask<2>(edgeDesc.constantCoordinateIndex)))
											continue;
										if (m_primitiveType == TESSPRIMITIVETYPE_ISOLINES && (vtx == Vec3(0.0f, 0.5f, 0.0f) || vtx == Vec3(1.0f, 0.5f, 0.0f) ||
																							  vtx == Vec3(0.0f, 0.0f, 0.0f) || vtx == Vec3(1.0f, 0.0f, 0.0f)))
											continue;

										const bool isMirrored = tfResult.varying[vtxNdx].w() > 0.5f;
										if (isMirrored)
											mirroredEdgeVertices.insert(vtx);
										else
											nonMirroredEdgeVertices.insert(vtx);
									}
								}

								if (m_primitiveType != TESSPRIMITIVETYPE_ISOLINES)
								{
									// Check that both endpoints are present. Note that endpoints aren't mirrored by the shader, since they belong to more than one edge.

									Vec3 endpointA;
									Vec3 endpointB;

									if (m_primitiveType == TESSPRIMITIVETYPE_TRIANGLES)
									{
										endpointA = tcu::select(Vec3(1.0f), Vec3(0.0f), singleTrueMask<3>((edgeDesc.constantCoordinateIndex + 1) % 3));
										endpointB = tcu::select(Vec3(1.0f), Vec3(0.0f), singleTrueMask<3>((edgeDesc.constantCoordinateIndex + 2) % 3));
									}
									else if (m_primitiveType == TESSPRIMITIVETYPE_QUADS)
									{
										endpointA.xy() = tcu::select(Vec2(edgeDesc.constantCoordinateValueChoices[0]), Vec2(0.0f), singleTrueMask<2>(edgeDesc.constantCoordinateIndex));
										endpointB.xy() = tcu::select(Vec2(edgeDesc.constantCoordinateValueChoices[0]), Vec2(1.0f), singleTrueMask<2>(edgeDesc.constantCoordinateIndex));
									}
									else
										DE_ASSERT(false);

									if (!contains(nonMirroredEdgeVertices, endpointA) ||
										!contains(nonMirroredEdgeVertices, endpointB))
									{
										log << TestLog::Message << "Failure: edge doesn't contain both endpoints, " << endpointA << " and " << endpointB << TestLog::EndMessage
											<< TestLog::Message << "Note: non-mirrored vertices:\n" << containerStr(nonMirroredEdgeVertices, 5)
																<< "\nmirrored vertices:\n" << containerStr(mirroredEdgeVertices, 5) << TestLog::EndMessage;
										m_testCtx.setTestResult(QP_TEST_RESULT_FAIL, "Invalid set of vertices");
										return STOP;
									}
									nonMirroredEdgeVertices.erase(endpointA);
									nonMirroredEdgeVertices.erase(endpointB);
								}

								if (nonMirroredEdgeVertices != mirroredEdgeVertices)
								{
									log << TestLog::Message << "Failure: the set of mirrored edges isn't equal to the set of non-mirrored edges (ignoring endpoints and possible middle)" << TestLog::EndMessage
										<< TestLog::Message << "Note: non-mirrored vertices:\n" << containerStr(nonMirroredEdgeVertices, 5)
																<< "\nmirrored vertices:\n" << containerStr(mirroredEdgeVertices, 5) << TestLog::EndMessage;
									m_testCtx.setTestResult(QP_TEST_RESULT_FAIL, "Invalid set of vertices");
									return STOP;
								}
							}
						}
					}
				}
			}
		}
	}

	m_testCtx.setTestResult(QP_TEST_RESULT_PASS, "Pass");
	return STOP;
}